

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImTextCharFromUtf8(uint *out_char,char *in_text,char *in_text_end)

{
  int iVar1;
  long lVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  
  bVar7 = *in_text;
  lVar8 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                [(uint)(bVar7 >> 3)];
  lVar2 = lVar8 + (ulong)((0x80ff0000U >> (uint)(bVar7 >> 3) & 1) != 0);
  pbVar4 = (byte *)(in_text + lVar2);
  if (in_text_end != (char *)0x0) {
    pbVar4 = (byte *)in_text_end;
  }
  bVar5 = 0;
  if (pbVar4 <= in_text) {
    bVar7 = 0;
  }
  if (in_text + 1 < pbVar4) {
    bVar5 = in_text[1];
  }
  if (in_text + 2 < pbVar4) {
    bVar9 = in_text[2];
  }
  else {
    bVar9 = 0;
  }
  if (in_text + 3 < pbVar4) {
    bVar6 = in_text[3];
  }
  else {
    bVar6 = 0;
  }
  uVar10 = (bVar6 & 0x3f |
           (bVar9 & 0x3f) << 6 |
           (bVar5 & 0x3f) << 0xc | ((uint)bVar7 & ImTextCharFromUtf8::masks[lVar8]) << 0x12) >>
           (*(byte *)(ImTextCharFromUtf8::shiftc + lVar8) & 0x1f);
  *out_char = uVar10;
  iVar1 = (int)lVar2;
  if ((((bVar5 >> 2 & 0xfffffff0) + (uint)(bVar9 >> 6) * 4 | (uint)(bVar6 >> 6) |
        (uint)(uVar10 < ImTextCharFromUtf8::mins[lVar8]) << 6 | (uint)(0x10ffff < uVar10) << 8 |
       (uint)((uVar10 & 0x7ffff800) == 0xd800) << 7) ^ 0x2a) >>
      (*(byte *)(ImTextCharFromUtf8::shifte + lVar8) & 0x1f) != 0) {
    iVar3 = ((((uint)(bVar5 != 0) - (uint)(bVar7 == 0)) - (uint)(bVar9 == 0)) + 3) -
            (uint)(bVar6 == 0);
    if (iVar1 < iVar3) {
      iVar3 = iVar1;
    }
    *out_char = 0xfffd;
    return iVar3;
  }
  return iVar1;
}

Assistant:

int ImTextCharFromUtf8(unsigned int* out_char, const char* in_text, const char* in_text_end)
{
    static const char lengths[32] = { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 2, 2, 2, 2, 3, 3, 4, 0 };
    static const int masks[]  = { 0x00, 0x7f, 0x1f, 0x0f, 0x07 };
    static const uint32_t mins[] = { 0x400000, 0, 0x80, 0x800, 0x10000 };
    static const int shiftc[] = { 0, 18, 12, 6, 0 };
    static const int shifte[] = { 0, 6, 4, 2, 0 };
    int len = lengths[*(const unsigned char*)in_text >> 3];
    int wanted = len + !len;

    if (in_text_end == NULL)
        in_text_end = in_text + wanted; // Max length, nulls will be taken into account.

    // Copy at most 'len' bytes, stop copying at 0 or past in_text_end. Branch predictor does a good job here,
    // so it is fast even with excessive branching.
    unsigned char s[4];
    s[0] = in_text + 0 < in_text_end ? in_text[0] : 0;
    s[1] = in_text + 1 < in_text_end ? in_text[1] : 0;
    s[2] = in_text + 2 < in_text_end ? in_text[2] : 0;
    s[3] = in_text + 3 < in_text_end ? in_text[3] : 0;

    // Assume a four-byte character and load four bytes. Unused bits are shifted out.
    *out_char  = (uint32_t)(s[0] & masks[len]) << 18;
    *out_char |= (uint32_t)(s[1] & 0x3f) << 12;
    *out_char |= (uint32_t)(s[2] & 0x3f) <<  6;
    *out_char |= (uint32_t)(s[3] & 0x3f) <<  0;
    *out_char >>= shiftc[len];

    // Accumulate the various error conditions.
    int e = 0;
    e  = (*out_char < mins[len]) << 6; // non-canonical encoding
    e |= ((*out_char >> 11) == 0x1b) << 7;  // surrogate half?
    e |= (*out_char > IM_UNICODE_CODEPOINT_MAX) << 8;  // out of range?
    e |= (s[1] & 0xc0) >> 2;
    e |= (s[2] & 0xc0) >> 4;
    e |= (s[3]       ) >> 6;
    e ^= 0x2a; // top two bits of each tail byte correct?
    e >>= shifte[len];

    if (e)
    {
        // No bytes are consumed when *in_text == 0 || in_text == in_text_end.
        // One byte is consumed in case of invalid first byte of in_text.
        // All available bytes (at most `len` bytes) are consumed on incomplete/invalid second to last bytes.
        // Invalid or incomplete input may consume less bytes than wanted, therefore every byte has to be inspected in s.
        wanted = ImMin(wanted, !!s[0] + !!s[1] + !!s[2] + !!s[3]);
        *out_char = IM_UNICODE_CODEPOINT_INVALID;
    }

    return wanted;
}